

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O2

void __thiscall
btHingeConstraint::btHingeConstraint
          (btHingeConstraint *this,btRigidBody *rbA,btVector3 *pivotInA,btVector3 *axisInA,
          bool useReferenceFrameA)

{
  undefined8 uVar1;
  btTransform *this_00;
  btScalar bVar2;
  btVector3 bVar3;
  btVector3 bVar4;
  btScalar local_a8;
  btScalar bStack_a4;
  btScalar local_98;
  btVector3 rbAxisB1;
  btQuaternion rotationArc;
  btVector3 axisInB;
  btVector3 rbAxisA2;
  btVector3 rbAxisA1;
  
  btTypedConstraint::btTypedConstraint(&this->super_btTypedConstraint,HINGE_CONSTRAINT_TYPE,rbA);
  (this->super_btTypedConstraint)._vptr_btTypedConstraint =
       (_func_int **)&PTR__btTypedConstraint_001f1380;
  (this->m_limit).m_center = 0.0;
  (this->m_limit).m_halfRange = -1.0;
  (this->m_limit).m_softness = 0.9;
  (this->m_limit).m_biasFactor = 0.3;
  (this->m_limit).m_relaxationFactor = 1.0;
  (this->m_limit).m_correction = 0.0;
  (this->m_limit).m_sign = 0.0;
  (this->m_limit).m_solveLimit = false;
  this->m_angularOnly = false;
  this->m_enableAngularMotor = false;
  this->m_useSolveConstraintObsolete = false;
  this->m_useOffsetForConstraintFrame = true;
  this->m_useReferenceFrameA = useReferenceFrameA;
  this->m_flags = 0;
  this->m_normalCFM = 0.0;
  this->m_normalERP = 0.0;
  this->m_stopCFM = 0.0;
  this->m_stopERP = 0.0;
  btPlaneSpace1<btVector3>(axisInA,&rbAxisA1,&rbAxisA2);
  uVar1 = *(undefined8 *)(pivotInA->m_floats + 2);
  *(undefined8 *)(this->m_rbAFrame).m_origin.m_floats = *(undefined8 *)pivotInA->m_floats;
  *(undefined8 *)((this->m_rbAFrame).m_origin.m_floats + 2) = uVar1;
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[0] = rbAxisA1.m_floats[0];
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[1] = rbAxisA2.m_floats[0];
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[2] = axisInA->m_floats[0];
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[3] = 0.0;
  (this->m_rbAFrame).m_basis.m_el[1].m_floats[0] = rbAxisA1.m_floats[1];
  (this->m_rbAFrame).m_basis.m_el[1].m_floats[1] = rbAxisA2.m_floats[1];
  (this->m_rbAFrame).m_basis.m_el[1].m_floats[2] = axisInA->m_floats[1];
  (this->m_rbAFrame).m_basis.m_el[1].m_floats[3] = 0.0;
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[0] = rbAxisA1.m_floats[2];
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[1] = rbAxisA2.m_floats[2];
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[2] = axisInA->m_floats[2];
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[3] = 0.0;
  this_00 = &(rbA->super_btCollisionObject).m_worldTransform;
  axisInB = operator*(&this_00->m_basis,axisInA);
  rotationArc = shortestArcQuat(axisInA,&axisInB);
  rbAxisB1 = quatRotate(&rotationArc,&rbAxisA1);
  bVar3 = btVector3::cross(&axisInB,&rbAxisB1);
  bVar4 = btTransform::operator()(this_00,pivotInA);
  *&(this->m_rbBFrame).m_origin.m_floats = bVar4.m_floats;
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[0] = rbAxisB1.m_floats[0];
  local_a8 = bVar3.m_floats[0];
  bStack_a4 = bVar3.m_floats[1];
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[1] = local_a8;
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[2] = axisInB.m_floats[0];
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[3] = 0.0;
  (this->m_rbBFrame).m_basis.m_el[1].m_floats[0] = rbAxisB1.m_floats[1];
  (this->m_rbBFrame).m_basis.m_el[1].m_floats[1] = bStack_a4;
  (this->m_rbBFrame).m_basis.m_el[1].m_floats[2] = axisInB.m_floats[1];
  (this->m_rbBFrame).m_basis.m_el[1].m_floats[3] = 0.0;
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[0] = rbAxisB1.m_floats[2];
  local_98 = bVar3.m_floats[2];
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[1] = local_98;
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[2] = axisInB.m_floats[2];
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[3] = 0.0;
  if (this->m_useReferenceFrameA == false) {
    bVar2 = 1.0;
  }
  else {
    bVar2 = -1.0;
  }
  this->m_referenceSign = bVar2;
  return;
}

Assistant:

btHingeConstraint::btHingeConstraint(btRigidBody& rbA,const btVector3& pivotInA,const btVector3& axisInA, bool useReferenceFrameA)
:btTypedConstraint(HINGE_CONSTRAINT_TYPE, rbA),
#ifdef _BT_USE_CENTER_LIMIT_
m_limit(),
#endif
m_angularOnly(false), m_enableAngularMotor(false), 
m_useSolveConstraintObsolete(HINGE_USE_OBSOLETE_SOLVER),
m_useOffsetForConstraintFrame(HINGE_USE_FRAME_OFFSET),
m_useReferenceFrameA(useReferenceFrameA),
m_flags(0),
m_normalCFM(0),
m_normalERP(0),
m_stopCFM(0),
m_stopERP(0)
{

	// since no frame is given, assume this to be zero angle and just pick rb transform axis
	// fixed axis in worldspace
	btVector3 rbAxisA1, rbAxisA2;
	btPlaneSpace1(axisInA, rbAxisA1, rbAxisA2);

	m_rbAFrame.getOrigin() = pivotInA;
	m_rbAFrame.getBasis().setValue( rbAxisA1.getX(),rbAxisA2.getX(),axisInA.getX(),
									rbAxisA1.getY(),rbAxisA2.getY(),axisInA.getY(),
									rbAxisA1.getZ(),rbAxisA2.getZ(),axisInA.getZ() );

	btVector3 axisInB = rbA.getCenterOfMassTransform().getBasis() * axisInA;

	btQuaternion rotationArc = shortestArcQuat(axisInA,axisInB);
	btVector3 rbAxisB1 =  quatRotate(rotationArc,rbAxisA1);
	btVector3 rbAxisB2 = axisInB.cross(rbAxisB1);


	m_rbBFrame.getOrigin() = rbA.getCenterOfMassTransform()(pivotInA);
	m_rbBFrame.getBasis().setValue( rbAxisB1.getX(),rbAxisB2.getX(),axisInB.getX(),
									rbAxisB1.getY(),rbAxisB2.getY(),axisInB.getY(),
									rbAxisB1.getZ(),rbAxisB2.getZ(),axisInB.getZ() );
	
#ifndef	_BT_USE_CENTER_LIMIT_
	//start with free
	m_lowerLimit = btScalar(1.0f);
	m_upperLimit = btScalar(-1.0f);
	m_biasFactor = 0.3f;
	m_relaxationFactor = 1.0f;
	m_limitSoftness = 0.9f;
	m_solveLimit = false;
#endif
	m_referenceSign = m_useReferenceFrameA ? btScalar(-1.f) : btScalar(1.f);
}